

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sha.c
# Opt level: O1

int ndn_sha256(uint8_t *data,uint32_t datalen,uint8_t *hash_result)

{
  int iVar1;
  int iVar2;
  undefined1 local_98 [8];
  ndn_sha256_state_t state;
  
  iVar1 = (*ndn_sha_backend.sha256_init)((abstract_sha256_state_t *)local_98);
  iVar2 = -0x1c;
  if (iVar1 == 0) {
    iVar1 = (*ndn_sha_backend.sha256_update)((abstract_sha256_state_t *)local_98,data,datalen);
    if (iVar1 == 0) {
      iVar1 = (*ndn_sha_backend.sha256_finish)((abstract_sha256_state_t *)local_98,hash_result);
      iVar2 = -0x19;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int
ndn_sha256(const uint8_t* data, uint32_t datalen, uint8_t* hash_result)
{
  ndn_sha256_state_t state;
  if (ndn_sha256_init(&state) != NDN_SUCCESS)
    return NDN_SEC_INIT_FAILURE;
  if (ndn_sha256_update(&state, data, datalen) != NDN_SUCCESS)
    return NDN_SEC_INIT_FAILURE;
  if (ndn_sha256_finish(&state, hash_result) != NDN_SUCCESS)
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  return NDN_SUCCESS;
}